

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathPopBoolean(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr val;
  int local_24;
  int ret;
  xmlXPathObjectPtr obj;
  xmlXPathParserContextPtr ctxt_local;
  
  val = valuePop(ctxt);
  if (val == (xmlXPathObjectPtr)0x0) {
    xmlXPatherror(ctxt,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                  ,0xb7c,10);
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 10;
    }
    ctxt_local._4_4_ = 0;
  }
  else {
    if (val->type == XPATH_BOOLEAN) {
      local_24 = val->boolval;
    }
    else {
      local_24 = xmlXPathCastToBoolean(val);
    }
    xmlXPathReleaseObject(ctxt->context,val);
    ctxt_local._4_4_ = local_24;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlXPathPopBoolean (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    int ret;

    obj = valuePop(ctxt);
    if (obj == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(0);
    }
    if (obj->type != XPATH_BOOLEAN)
	ret = xmlXPathCastToBoolean(obj);
    else
        ret = obj->boolval;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}